

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnionDatatypeValidator.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::UnionDatatypeValidator::serialize
          (UnionDatatypeValidator *this,XSerializeEngine *serEng)

{
  DatatypeValidator::serialize(&this->super_DatatypeValidator,serEng);
  if (serEng->fStoreLoad != 0) {
    XSerializeEngine::operator>>(serEng,&this->fEnumerationInherited);
    XSerializeEngine::operator>>(serEng,&this->fMemberTypesInherited);
    XTemplateSerializer::loadObject(&this->fEnumeration,8,true,serEng);
    XTemplateSerializer::loadObject(&this->fMemberTypeValidators,4,false,serEng);
    return;
  }
  XSerializeEngine::operator<<(serEng,this->fEnumerationInherited);
  XSerializeEngine::operator<<(serEng,this->fMemberTypesInherited);
  XTemplateSerializer::storeObject(this->fEnumeration,serEng);
  XTemplateSerializer::storeObject(this->fMemberTypeValidators,serEng);
  return;
}

Assistant:

void UnionDatatypeValidator::serialize(XSerializeEngine& serEng)
{

    DatatypeValidator::serialize(serEng);

    if (serEng.isStoring())
    {
        serEng<<fEnumerationInherited;
        serEng<<fMemberTypesInherited;

        /***
         * Serialize RefArrayVectorOf<XMLCh>
         * Serialize RefVectorOf<DatatypeValidator>
         ***/
        XTemplateSerializer::storeObject(fEnumeration, serEng);
        XTemplateSerializer::storeObject(fMemberTypeValidators, serEng);
    }
    else
    {
        serEng>>fEnumerationInherited;
        serEng>>fMemberTypesInherited;

        /***
         * Deserialize RefArrayVectorOf<XMLCh>
         * Deserialize RefVectorOf<DatatypeValidator>
         ***/
        XTemplateSerializer::loadObject(&fEnumeration, 8, true, serEng);
        XTemplateSerializer::loadObject(&fMemberTypeValidators, 4, false, serEng);
    }
}